

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::
     Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::__cxx11::string>>
               (PropagatingCountingAlloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *alloc,void *p,size_t n)

{
  PropagatingCountingAlloc<M> local_28;
  A mem_alloc;
  size_t n_local;
  void *p_local;
  PropagatingCountingAlloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *alloc_local;
  
  mem_alloc.super_CountingAllocator<M>.bytes_used_ = (CountingAllocator<M>)(CountingAllocator<M>)n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x106f,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::basic_string<char>>]"
                 );
  }
  (anonymous_namespace)::
  PropagatingCountingAlloc<phmap::priv::Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::__cxx11::string>>(phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::__cxx11::string>*,void*,unsigned_long)::M>
  ::PropagatingCountingAlloc<std::__cxx11::string>
            ((PropagatingCountingAlloc<phmap::priv::Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::__cxx11::string>>(phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::__cxx11::string>*,void*,unsigned_long)::M>
              *)&local_28,alloc);
  allocator_traits<phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<M>_>::deallocate
            (&local_28,(pointer)p,(long)mem_alloc.super_CountingAllocator<M>.bytes_used_ + 7U >> 3);
  anon_unknown_0::PropagatingCountingAlloc<M>::~PropagatingCountingAlloc(&local_28);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}